

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O1

void __thiscall CConnman::Init(CConnman *this,Options *connOptions)

{
  pointer pbVar1;
  pointer pcVar2;
  NetEventsInterface *pNVar3;
  uint uVar4;
  ServiceFlags SVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer pbVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  unique_lock<std::mutex> local_70;
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined1 local_40;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->nLocalServices = connOptions->nLocalServices;
  iVar6 = connOptions->m_max_automatic_connections;
  iVar8 = 8;
  if (iVar6 < 8) {
    iVar8 = iVar6;
  }
  this->m_max_automatic_connections = iVar6;
  this->m_max_outbound_full_relay = iVar8;
  iVar7 = 2;
  if (iVar6 - iVar8 < 2) {
    iVar7 = iVar6 - iVar8;
  }
  this->m_max_outbound_block_relay = iVar7;
  iVar8 = iVar7 + iVar8 + this->m_max_feeler;
  this->m_max_automatic_outbound = iVar8;
  iVar6 = iVar6 - iVar8;
  iVar8 = 0;
  if (0 < iVar6) {
    iVar8 = iVar6;
  }
  this->m_max_inbound = iVar8;
  this->m_use_addrman_outgoing = connOptions->m_use_addrman_outgoing;
  this->m_banman = connOptions->m_banman;
  pNVar3 = connOptions->m_msgproc;
  this->m_client_interface = connOptions->uiInterface;
  this->m_msgproc = pNVar3;
  uVar4 = connOptions->nReceiveFloodSize;
  this->nSendBufferMaxSize = connOptions->nSendBufferMaxSize;
  this->nReceiveFloodSize = uVar4;
  (this->m_peer_connect_timeout).__r = connOptions->m_peer_connect_timeout;
  local_60[8] = false;
  local_60._0_8_ = this;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
  this->nMaxOutboundLimit = connOptions->nMaxOutboundLimit;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::operator=
            (&this->vWhitelistedRangeIncoming,&connOptions->vWhitelistedRangeIncoming);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::operator=
            (&this->vWhitelistedRangeOutgoing,&connOptions->vWhitelistedRangeOutgoing);
  local_70._M_device = &(this->m_added_nodes_mutex).super_mutex;
  local_70._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_70);
  pbVar9 = (connOptions->m_added_nodes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (connOptions->m_added_nodes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar1) {
    SVar5 = this->nLocalServices;
    do {
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      local_60._0_8_ = (CConnman *)&stack0xffffffffffffffb0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + pbVar9->_M_string_length);
      local_40 = (byte)((uint)(int)SVar5 >> 0xb) & 1;
      std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::emplace_back<AddedNodeParams>
                (&this->m_added_node_params,(AddedNodeParams *)local_60);
      if ((CConnman *)local_60._0_8_ != (CConnman *)&stack0xffffffffffffffb0) {
        operator_delete((void *)local_60._0_8_,local_50 + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_70);
  std::vector<CService,_std::allocator<CService>_>::operator=
            (&this->m_onion_binds,&connOptions->onion_binds);
  this->whitelist_forcerelay = connOptions->whitelist_forcerelay;
  this->whitelist_relay = connOptions->whitelist_relay;
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == (__pthread_internal_list *)local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_added_nodes_mutex, !m_total_bytes_sent_mutex)
    {
        AssertLockNotHeld(m_total_bytes_sent_mutex);

        nLocalServices = connOptions.nLocalServices;
        m_max_automatic_connections = connOptions.m_max_automatic_connections;
        m_max_outbound_full_relay = std::min(MAX_OUTBOUND_FULL_RELAY_CONNECTIONS, m_max_automatic_connections);
        m_max_outbound_block_relay = std::min(MAX_BLOCK_RELAY_ONLY_CONNECTIONS, m_max_automatic_connections - m_max_outbound_full_relay);
        m_max_automatic_outbound = m_max_outbound_full_relay + m_max_outbound_block_relay + m_max_feeler;
        m_max_inbound = std::max(0, m_max_automatic_connections - m_max_automatic_outbound);
        m_use_addrman_outgoing = connOptions.m_use_addrman_outgoing;
        m_client_interface = connOptions.uiInterface;
        m_banman = connOptions.m_banman;
        m_msgproc = connOptions.m_msgproc;
        nSendBufferMaxSize = connOptions.nSendBufferMaxSize;
        nReceiveFloodSize = connOptions.nReceiveFloodSize;
        m_peer_connect_timeout = std::chrono::seconds{connOptions.m_peer_connect_timeout};
        {
            LOCK(m_total_bytes_sent_mutex);
            nMaxOutboundLimit = connOptions.nMaxOutboundLimit;
        }
        vWhitelistedRangeIncoming = connOptions.vWhitelistedRangeIncoming;
        vWhitelistedRangeOutgoing = connOptions.vWhitelistedRangeOutgoing;
        {
            LOCK(m_added_nodes_mutex);
            // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
            // peer doesn't support it or immediately disconnects us for another reason.
            const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
            for (const std::string& added_node : connOptions.m_added_nodes) {
                m_added_node_params.push_back({added_node, use_v2transport});
            }
        }
        m_onion_binds = connOptions.onion_binds;
        whitelist_forcerelay = connOptions.whitelist_forcerelay;
        whitelist_relay = connOptions.whitelist_relay;
    }